

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_stats.c
# Opt level: O0

void cram_stats_del(cram_stats *st,int32_t val)

{
  int *piVar1;
  khint_t x;
  int iVar2;
  khint_t k;
  int32_t val_local;
  cram_stats *st_local;
  
  st->nsamp = st->nsamp + -1;
  if ((val < 0x400) && (-1 < val)) {
    st->freqs[val] = st->freqs[val] + -1;
    if (st->freqs[val] < 0) {
      __assert_fail("st->freqs[val] >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_stats.c"
                    ,0x55,"void cram_stats_del(cram_stats *, int32_t)");
    }
  }
  else if (st->h == (kh_m_i2i_t *)0x0) {
    fprintf(_stderr,"Failed to remove val %d from cram_stats\n",(ulong)(uint)val);
    st->nsamp = st->nsamp + 1;
  }
  else {
    x = kh_get_m_i2i(st->h,val);
    if (x == st->h->n_buckets) {
      fprintf(_stderr,"Failed to remove val %d from cram_stats\n",(ulong)(uint)val);
      st->nsamp = st->nsamp + 1;
    }
    else {
      piVar1 = st->h->vals;
      iVar2 = piVar1[x] + -1;
      piVar1[x] = iVar2;
      if (iVar2 == 0) {
        kh_del_m_i2i(st->h,x);
      }
    }
  }
  return;
}

Assistant:

void cram_stats_del(cram_stats *st, int32_t val) {
    st->nsamp--;

    //assert(val >= 0);

    if (val < MAX_STAT_VAL && val >= 0) {
	st->freqs[val]--;
	assert(st->freqs[val] >= 0);
    } else if (st->h) {
	khint_t k = kh_get(m_i2i, st->h, val);

	if (k != kh_end(st->h)) {
	    if (--kh_val(st->h, k) == 0)
		kh_del(m_i2i, st->h, k);
	} else {
	    fprintf(stderr, "Failed to remove val %d from cram_stats\n", val);
	    st->nsamp++;
	}
    } else {
	fprintf(stderr, "Failed to remove val %d from cram_stats\n", val);
	st->nsamp++;
    }
}